

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  uint uVar2;
  format_specs *spec;
  basic_buffer<char> *pbVar3;
  size_t sVar4;
  ssize_t extraout_RAX;
  void *pvVar5;
  char *data;
  char *__src;
  ulong __n_00;
  str_writer<char> local_38;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  __n_00 = (ulong)(uint)__fd ^ 5;
  spec = this->specs_;
  if (spec != (format_specs *)0x0) {
    uVar2 = (spec->super_core_format_specs).precision;
    local_38.size_ = (ulong)uVar2;
    if (__n_00 <= uVar2) {
      local_38.size_ = __n_00;
    }
    if ((int)uVar2 < 0) {
      local_38.size_ = __n_00;
    }
    local_38.s = __src;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,&spec->super_align_spec,&local_38);
    return extraout_RAX;
  }
  pbVar3 = (this->writer_).out_.container;
  sVar4 = pbVar3->size_;
  uVar1 = sVar4 + __n_00;
  if (pbVar3->capacity_ < uVar1) {
    (**pbVar3->_vptr_basic_buffer)(pbVar3,uVar1);
  }
  pbVar3->size_ = uVar1;
  pvVar5 = memcpy(pbVar3->ptr_ + sVar4,__src,__n_00);
  return (ssize_t)pvVar5;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }